

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O2

void __thiscall
cmRulePlaceholderExpander::cmRulePlaceholderExpander
          (cmRulePlaceholderExpander *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *compilers,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variableMappings,string *compilerSysroot,string *linkerSysroot)

{
  (this->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander =
       (_func_int **)&PTR__cmRulePlaceholderExpander_0077e708;
  (this->TargetImpLib)._M_dataplus._M_p = (pointer)&(this->TargetImpLib).field_2;
  (this->TargetImpLib)._M_string_length = 0;
  (this->TargetImpLib).field_2._M_local_buf[0] = '\0';
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->Compilers)._M_t._M_impl.super__Rb_tree_header,
             &(compilers->_M_t)._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header,
             &(variableMappings->_M_t)._M_impl.super__Rb_tree_header);
  std::__cxx11::string::string((string *)&this->CompilerSysroot,(string *)compilerSysroot);
  std::__cxx11::string::string((string *)&this->LinkerSysroot,(string *)linkerSysroot);
  this->OutputConverter = (cmOutputConverter *)0x0;
  this->ReplaceValues = (RuleVariables *)0x0;
  return;
}

Assistant:

cmRulePlaceholderExpander::cmRulePlaceholderExpander(
  std::map<std::string, std::string> compilers,
  std::map<std::string, std::string> variableMappings,
  std::string compilerSysroot, std::string linkerSysroot)
  : Compilers(std::move(compilers))
  , VariableMappings(std::move(variableMappings))
  , CompilerSysroot(std::move(compilerSysroot))
  , LinkerSysroot(std::move(linkerSysroot))
{
}